

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1869::run(TestCase1869 *this)

{
  float local_150;
  float local_14c;
  DebugComparison<float,_float> _kjCondition;
  Builder root;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestWholeFloatDefault>
            (&root,&message.super_MessageBuilder);
  _kjCondition.right = (float)(*root._builder.data ^ 0x42f60000);
  _kjCondition.result = _kjCondition.right == 123.0;
  _kjCondition.left = 123.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
    local_14c = 123.0;
    local_150 = _kjCondition.right;
    kj::_::Debug::log<char_const(&)[47],kj::_::DebugComparison<float,float>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x751,ERROR,
               "\"failed: expected \" \"(123.0f) == (root.getField())\", _kjCondition, 123.0f, root.getField()"
               ,(char (*) [47])"failed: expected (123.0f) == (root.getField())",&_kjCondition,
               &local_14c,&local_150);
  }
  _kjCondition.right = (float)(*(uint *)((long)root._builder.data + 4) ^ 0x71c9f2ca);
  _kjCondition.result = _kjCondition.right == 2e+30;
  _kjCondition.left = 2e+30;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.right != 2e+30) || (NAN(_kjCondition.right))) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_14c = 2e+30;
    local_150 = _kjCondition.right;
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,float>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x752,ERROR,
               "\"failed: expected \" \"(2e30f) == (root.getBigField())\", _kjCondition, 2e30f, root.getBigField()"
               ,(char (*) [49])"failed: expected (2e30f) == (root.getBigField())",&_kjCondition,
               &local_14c,&local_150);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Encoding, WholeFloatDefault) {
  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestWholeFloatDefault>();

  EXPECT_EQ(123.0f, root.getField());
  EXPECT_EQ(2e30f, root.getBigField());
  EXPECT_EQ(456.0f, test::TestWholeFloatDefault::CONSTANT);
  EXPECT_EQ(4e30f, test::TestWholeFloatDefault::BIG_CONSTANT);
}